

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_36_c.c
# Opt level: O1

char * decode_pure(int *digits_values,uint digits_size,char *s,uint s_size,int *result)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  
  if (s_size == 0) {
    iVar8 = 0;
    bVar2 = true;
  }
  else {
    iVar6 = 0;
    pcVar5 = "invalid number literal.";
    lVar9 = 0;
    iVar8 = 0;
    bVar3 = false;
    bVar2 = false;
    do {
      cVar1 = s[lVar9];
      if ((long)cVar1 < 0) goto LAB_00123b1d;
      if (cVar1 == '-') {
        bVar2 = true;
        bVar4 = true;
        if (bVar3) goto LAB_00123b1d;
      }
      else if (cVar1 == ' ') {
        uVar7 = 1;
        if (bVar3) {
          uVar7 = digits_size;
        }
        iVar8 = iVar8 * uVar7;
        bVar4 = bVar3;
      }
      else {
        uVar7 = digits_values[cVar1];
        if (((int)uVar7 < 0) || (digits_size <= uVar7)) goto LAB_00123b1d;
        iVar8 = iVar8 * digits_size + uVar7;
        bVar4 = true;
      }
      bVar3 = bVar4;
      lVar9 = lVar9 + 1;
    } while (s_size != (uint)lVar9);
    bVar2 = !bVar2;
  }
  iVar6 = -iVar8;
  if (bVar2) {
    iVar6 = iVar8;
  }
  pcVar5 = (char *)0x0;
LAB_00123b1d:
  *result = iVar6;
  return pcVar5;
}

Assistant:

static
const char*
decode_pure(
  const int* digits_values,
  unsigned digits_size,
  const char* s,
  unsigned s_size,
  int* result)
{
  int si, dv;
  int have_minus = 0;
  int have_non_blank = 0;
  int value = 0;
  unsigned i = 0;
  for(;i<s_size;i++) {
    si = s[i];
    if (si < 0 || si > 127) {
      *result = 0;
      return invalid_number_literal();
    }
    if (si == ' ') {
      if (!have_non_blank) continue;
      value *= digits_size;
    }
    else if (si == '-') {
      if (have_non_blank) {
        *result = 0;
        return invalid_number_literal();
      }
      have_non_blank = 1;
      have_minus = 1;
      continue;
    }
    else {
      have_non_blank = 1;
      dv = digits_values[si];
      if (dv < 0 || dv >= digits_size) {
        *result = 0;
        return invalid_number_literal();
      }
      value *= digits_size;
      value += dv;
    }
  }
  if (have_minus) value = -value;
  *result = value;
  return 0;
}